

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materialized_query_result.cpp
# Opt level: O1

string * __thiscall
duckdb::MaterializedQueryResult::ToBox_abi_cxx11_
          (string *__return_storage_ptr__,MaterializedQueryResult *this,ClientContext *context,
          BoxRendererConfig *config)

{
  pointer pcVar1;
  ColumnDataCollection *result;
  long lVar2;
  char *pcVar3;
  undefined8 *puVar4;
  byte bVar5;
  BoxRenderer renderer;
  undefined1 local_198 [32];
  _Alloc_hider local_178;
  char local_168 [16];
  undefined8 local_158 [15];
  BoxRenderer local_e0;
  
  bVar5 = 0;
  if ((this->super_QueryResult).super_BaseQueryResult.success == false) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->super_QueryResult).super_BaseQueryResult.error.final_message._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (this->super_QueryResult).super_BaseQueryResult.error.final_message.
                        _M_string_length);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else if ((this->collection).
           super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
           .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl ==
           (ColumnDataCollection *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,
               "Internal error - result was successful but there was no collection","");
  }
  else {
    local_198._0_4_ = (undefined4)config->max_width;
    local_198._4_4_ = *(undefined4 *)((long)&config->max_width + 4);
    local_198._8_4_ = (undefined4)config->max_rows;
    local_198._12_4_ = *(undefined4 *)((long)&config->max_rows + 4);
    local_198._16_4_ = (undefined4)config->limit;
    local_198._20_4_ = *(undefined4 *)((long)&config->limit + 4);
    local_198._24_4_ = (undefined4)config->max_col_width;
    local_198._28_4_ = *(undefined4 *)((long)&config->max_col_width + 4);
    pcVar1 = (config->null_value)._M_dataplus._M_p;
    local_178._M_p = local_168;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,pcVar1,pcVar1 + (config->null_value)._M_string_length);
    pcVar3 = &config->decimal_separator;
    puVar4 = local_158;
    for (lVar2 = 0xf; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *(undefined8 *)pcVar3;
      pcVar3 = pcVar3 + ((ulong)bVar5 * -2 + 1) * 8;
      puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
    }
    BoxRenderer::BoxRenderer(&local_e0,(BoxRendererConfig *)local_198);
    if (local_178._M_p != local_168) {
      operator_delete(local_178._M_p);
    }
    result = Collection(this);
    BoxRenderer::ToString
              (__return_storage_ptr__,&local_e0,context,
               &(this->super_QueryResult).super_BaseQueryResult.names,result);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0.config.null_value._M_dataplus._M_p != &local_e0.config.null_value.field_2) {
      operator_delete(local_e0.config.null_value._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string MaterializedQueryResult::ToBox(ClientContext &context, const BoxRendererConfig &config) {
	if (!success) {
		return GetError() + "\n";
	}
	if (!collection) {
		return "Internal error - result was successful but there was no collection";
	}
	BoxRenderer renderer(config);
	return renderer.ToString(context, names, Collection());
}